

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::FuncArgsAssignment::updateFuncFrame(FuncArgsAssignment *this,FuncFrame *frame)

{
  Error EVar1;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  if (*(long *)this != 0) {
    constraints._availableRegs._data[0] = 0;
    constraints._availableRegs._data[1] = 0;
    constraints._availableRegs._data[2] = 0;
    constraints._availableRegs._data[3] = 0;
    EVar1 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)frame->_arch);
    if (EVar1 == 0) {
      FuncArgsContext::FuncArgsContext(&ctx);
      EVar1 = FuncArgsContext::initWorkData(&ctx,frame,this,&constraints);
      if (EVar1 == 0) {
        EVar1 = FuncArgsContext::markDstRegsDirty(&ctx,frame);
        if (EVar1 == 0) {
          EVar1 = FuncArgsContext::markScratchRegs(&ctx,frame);
          if (EVar1 == 0) {
            EVar1 = FuncArgsContext::markStackArgsReg(&ctx,frame);
          }
        }
      }
    }
    return EVar1;
  }
  return 3;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsAssignment::updateFuncFrame(FuncFrame& frame) const noexcept {
  Arch arch = frame.arch();
  const FuncDetail* func = funcDetail();

  if (!func)
    return DebugUtils::errored(kErrorInvalidState);

  RAConstraints constraints;
  ASMJIT_PROPAGATE(constraints.init(arch));

  FuncArgsContext ctx;
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, *this, &constraints));
  ASMJIT_PROPAGATE(ctx.markDstRegsDirty(frame));
  ASMJIT_PROPAGATE(ctx.markScratchRegs(frame));
  ASMJIT_PROPAGATE(ctx.markStackArgsReg(frame));
  return kErrorOk;
}